

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional.cxx
# Opt level: O3

void __thiscall
ExchCXX::XCFunctional::eval_exc_vxc
          (XCFunctional *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          host_buffer_type eps,host_buffer_type vrho,host_buffer_type vsigma)

{
  double dVar1;
  impl_ptr iVar2;
  char cVar3;
  int iVar4;
  __normal_iterator<const_std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
  _Var5;
  pointer ppVar6;
  size_type sVar7;
  exchcxx_exception *this_00;
  undefined8 uVar8;
  size_type __new_size;
  pair<double,_ExchCXX::XCKernel> *ppVar9;
  host_buffer_type pdVar10;
  pair<double,_ExchCXX::XCKernel> *ppVar11;
  ulong uVar12;
  host_buffer_type pdVar13;
  size_type __new_size_00;
  vector<double,_std::allocator<double>_> vsigma_scr;
  vector<double,_std::allocator<double>_> vrho_scr;
  vector<double,_std::allocator<double>_> eps_scr;
  size_type local_108;
  host_buffer_type local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_88;
  string local_70;
  string local_50;
  
  throw_if_not_sane(this);
  throw_if_not_sane(this);
  ppVar11 = (this->kernels_).
            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_gga()const::_lambda(auto:1_const&)_1_>>
                    ((this->kernels_).
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVar11);
  if (_Var5._M_current != ppVar11) {
    throw_if_not_sane(this);
    ppVar11 = (this->kernels_).
              super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_pred<ExchCXX::XCFunctional::is_mgga()const::_lambda(auto:1_const&)_1_>>
                      ((this->kernels_).
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,ppVar11);
    if (_Var5._M_current == ppVar11) {
      throw_if_not_sane(this);
      ppVar6 = (this->kernels_).
               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->kernels_).
          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == ppVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0016785b:
        uVar8 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        __clang_call_terminate(uVar8);
      }
      __new_size_00 = (size_type)N;
      iVar4 = (*((ppVar6->second).pimpl_._M_t.
                 super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                _vptr_XCKernelImpl[7])();
      __new_size = __new_size_00 << ((byte)iVar4 & 0x3f);
      throw_if_not_sane(this);
      ppVar11 = (this->kernels_).
                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_negate<ExchCXX::XCFunctional::is_lda()const::_lambda(auto:1_const&)_1_>>
                        ((this->kernels_).
                         super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (_Var5._M_current == ppVar11) {
        local_108 = 0;
      }
      else {
        throw_if_not_sane(this);
        ppVar6 = (this->kernels_).
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->kernels_).
            super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == ppVar6) goto LAB_0016785b;
        iVar4 = (*((ppVar6->second).pimpl_._M_t.
                   super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                   .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl)->
                  _vptr_XCKernelImpl[7])();
        local_108 = __new_size_00 * 3;
        if ((char)iVar4 == '\0') {
          local_108 = __new_size_00;
        }
      }
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (host_buffer_type)0x0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (host_buffer_type)0x0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (host_buffer_type)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ppVar11 = (this->kernels_).
                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((0x10 < (ulong)((long)ppVar11 -
                         (long)(this->kernels_).
                               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) &&
         (_Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_negate<ExchCXX::XCFunctional::supports_inc_interface()const::_lambda(auto:1_const&)_1_>>
                            (), _Var5._M_current != ppVar11)) {
        std::vector<double,_std::allocator<double>_>::resize(&local_88,__new_size_00);
        std::vector<double,_std::allocator<double>_>::resize(&local_a8,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(&local_c8,local_108);
      }
      if (N != 0) {
        memset(eps,0,__new_size_00 * 8);
        memset(vrho,0,__new_size * 8);
      }
      if (local_108 != 0) {
        memset(vsigma,0,local_108 * 8);
      }
      ppVar11 = (this->kernels_).
                super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 = (this->kernels_).
               super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar9 != ppVar11) {
        uVar12 = 0;
        do {
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>const*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,__gnu_cxx::__ops::_Iter_negate<ExchCXX::XCFunctional::supports_inc_interface()const::_lambda(auto:1_const&)_1_>>
                            (ppVar11,ppVar9);
          if (_Var5._M_current == ppVar9) {
            cVar3 = (**(code **)(*(long *)(this->kernels_).
                                          super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar12].second.
                                          pimpl_._M_t + 0x20))();
            ppVar6 = (this->kernels_).
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar2._M_t.
            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
                 ppVar6[uVar12].second.pimpl_._M_t;
            if (cVar3 == '\0') {
              (**(code **)(*(long *)iVar2._M_t.
                                    super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                    _M_head_impl + 0x80))
                        (ppVar6[uVar12].first,
                         iVar2._M_t.
                         super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl
                         ,N,rho,eps,vrho);
            }
            else {
              (**(code **)(*(long *)iVar2._M_t.
                                    super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                    _M_head_impl + 0xa0))
                        (iVar2._M_t.
                         super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl
                         ,N,rho,sigma,eps,vrho,vsigma);
            }
          }
          else {
            if (uVar12 == 0) {
              ppVar6 = (this->kernels_).
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_e8 = vsigma;
              pdVar10 = vrho;
              pdVar13 = eps;
            }
            else {
              local_e8 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
              ppVar6 = (this->kernels_).
                       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar12;
              pdVar10 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            cVar3 = (**(code **)(*(long *)(ppVar6->second).pimpl_._M_t + 0x20))();
            iVar2._M_t.
            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
                 (this->kernels_).
                 super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].second.pimpl_._M_t;
            if (cVar3 == '\0') {
              (**(code **)(*(long *)iVar2._M_t.
                                    super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                    _M_head_impl + 0x70))
                        (iVar2._M_t.
                         super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl
                         ,N,rho,pdVar13,pdVar10);
            }
            else {
              (**(code **)(*(long *)iVar2._M_t.
                                    super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                    _M_head_impl + 0x90))
                        (iVar2._M_t.
                         super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl
                         ,N,rho,sigma,pdVar13,pdVar10,local_e8);
            }
            ppVar6 = (this->kernels_).
                     super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar12 == 0) {
              if (N != 0) {
                dVar1 = ppVar6->first;
                sVar7 = 0;
                do {
                  eps[sVar7] = eps[sVar7] * dVar1;
                  sVar7 = sVar7 + 1;
                } while (__new_size_00 != sVar7);
                if (N != 0) {
                  dVar1 = ppVar6->first;
                  sVar7 = 0;
                  do {
                    vrho[sVar7] = vrho[sVar7] * dVar1;
                    sVar7 = sVar7 + 1;
                  } while (__new_size != sVar7);
                }
              }
              cVar3 = (**(code **)(*(long *)(ppVar6->second).pimpl_._M_t + 0x20))();
              if ((cVar3 != '\0') && (local_108 != 0)) {
                dVar1 = ((this->kernels_).
                         super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first;
                sVar7 = 0;
                do {
                  vsigma[sVar7] = vsigma[sVar7] * dVar1;
                  sVar7 = sVar7 + 1;
                } while (local_108 != sVar7);
              }
            }
            else {
              if (N != 0) {
                dVar1 = ppVar6[uVar12].first;
                sVar7 = 0;
                do {
                  eps[sVar7] = pdVar13[sVar7] * dVar1 + eps[sVar7];
                  sVar7 = sVar7 + 1;
                } while (__new_size_00 != sVar7);
                if (N != 0) {
                  dVar1 = ppVar6[uVar12].first;
                  sVar7 = 0;
                  do {
                    vrho[sVar7] = pdVar10[sVar7] * dVar1 + vrho[sVar7];
                    sVar7 = sVar7 + 1;
                  } while (__new_size != sVar7);
                }
              }
              cVar3 = (**(code **)(*(long *)ppVar6[uVar12].second.pimpl_ + 0x20))();
              if ((cVar3 != '\0') && (local_108 != 0)) {
                dVar1 = (this->kernels_).
                        super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12].first;
                sVar7 = 0;
                do {
                  vsigma[sVar7] = local_e8[sVar7] * dVar1 + vsigma[sVar7];
                  sVar7 = sVar7 + 1;
                } while (local_108 != sVar7);
              }
            }
          }
          uVar12 = uVar12 + 1;
          ppVar11 = (this->kernels_).
                    super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar9 = (this->kernels_).
                   super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar12 < (ulong)((long)ppVar9 - (long)ppVar11 >> 4));
      }
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (host_buffer_type)0x0) {
        operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  this_00 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/xc_functional.cxx"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"KERNEL IS NOT GGA","");
  exchcxx_exception::exchcxx_exception(this_00,&local_70,0x15e,&local_50);
  __cxa_throw(this_00,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

GGA_EXC_VXC_GENERATOR( XCFunctional::eval_exc_vxc ) const {

  throw_if_not_sane();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT GGA",  is_gga() );

  const size_t len_exc_buffer    = exc_buffer_len(N);
  const size_t len_vrho_buffer   = vrho_buffer_len(N);
  const size_t len_vsigma_buffer = vsigma_buffer_len(N);

  std::vector<double> eps_scr, vrho_scr, vsigma_scr;
  if( kernels_.size() > 1 and not supports_inc_interface() ) {
    eps_scr.resize( len_exc_buffer );
    vrho_scr.resize( len_vrho_buffer );
    vsigma_scr.resize( len_vsigma_buffer );
  }

  std::fill_n( eps, len_exc_buffer, 0. );
  std::fill_n( vrho, len_vrho_buffer, 0. );
  std::fill_n( vsigma, len_vsigma_buffer, 0. );

  for( auto i = 0ul; i < kernels_.size(); ++i ) {

    if( supports_inc_interface() ) {

      if( kernels_[i].second.is_gga() )
        kernels_[i].second.eval_exc_vxc_inc(
          kernels_[i].first, N, rho, sigma, eps, vrho, 
          vsigma 
        );
      else
        kernels_[i].second.eval_exc_vxc_inc(
          kernels_[i].first, N, rho, eps, vrho
        );

    } else {

      double* eps_eval    = i ? eps_scr.data()    : eps;
      double* vrho_eval   = i ? vrho_scr.data()   : vrho;
      double* vsigma_eval = i ? vsigma_scr.data() : vsigma;

      if( kernels_[i].second.is_gga() )
        kernels_[i].second.eval_exc_vxc(N, rho, sigma, eps_eval, vrho_eval, 
          vsigma_eval );
      else
        kernels_[i].second.eval_exc_vxc(N, rho, eps_eval, vrho_eval);

      if( i ) {

        _addscal( len_exc_buffer,    kernels_[i].first, eps,    eps_eval  );
        _addscal( len_vrho_buffer,   kernels_[i].first, vrho,   vrho_eval );
   
        if( kernels_[i].second.is_gga() )
          _addscal( len_vsigma_buffer, kernels_[i].first, vsigma, vsigma_eval );

      } else {

        _scal( len_exc_buffer,    kernels_[i].first, eps  );
        _scal( len_vrho_buffer,   kernels_[i].first, vrho );

        if( kernels_[i].second.is_gga() )
          _scal( len_vsigma_buffer, kernels_[i].first, vsigma );

      }

    }
  
  }

}